

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmuni.h
# Opt level: O0

wchar_t __thiscall CVmCaseFoldStr::getch(CVmCaseFoldStr *this)

{
  wchar_t ch_00;
  wchar_t *pwVar1;
  undefined8 *in_RDI;
  wchar_t ch;
  
  if (((undefined8 *)*in_RDI != in_RDI + 2) && (*(int *)*in_RDI == 0)) {
    if (in_RDI[4] == 0) {
      return L'\0';
    }
    pwVar1 = (wchar_t *)in_RDI[3];
    in_RDI[3] = pwVar1 + 1;
    ch_00 = *pwVar1;
    in_RDI[4] = in_RDI[4] + -1;
    pwVar1 = t3_to_fold(ch_00);
    *in_RDI = pwVar1;
    if (pwVar1 == (wchar_t *)0x0) {
      *(wchar_t *)(in_RDI + 2) = ch_00;
      *in_RDI = in_RDI + 2;
      in_RDI[1] = in_RDI + 2;
    }
  }
  pwVar1 = (wchar_t *)*in_RDI;
  *in_RDI = pwVar1 + 1;
  return *pwVar1;
}

Assistant:

wchar_t getch()
    {
        /* if the expansion is exhausted, expand the next source character */
        if (fp != ie && *fp == 0)
        {
            /* if there's nothing left in the source string, we're done */
            if (rem == 0)
                return 0;

            /* get the next source character */
            wchar_t ch = *p++;
            --rem;

            /* get its case-folded expansion */
            if ((fp = t3_to_fold(ch)) == 0)
            {
                ie[0] = ch;
                fpbase = fp = ie;
            }
        }

        /* return the next expansion character */
        return *fp++;
    }